

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O0

void __thiscall
dtc::text_input_buffer::parse_error(text_input_buffer *this,char *msg,input_buffer *b,int loc)

{
  FILE *__stream;
  undefined8 uVar1;
  char local_49;
  int local_3c;
  int iStack_38;
  char c;
  int i_2;
  int i_1;
  int i;
  int line_end;
  int line_start;
  int line_count;
  int loc_local;
  input_buffer *b_local;
  char *msg_local;
  text_input_buffer *this_local;
  
  __stream = _stderr;
  line_end = 1;
  i = 0;
  if ((-1 < loc) && (i_2 = loc, loc <= b->size)) {
    for (; 0 < i_2; i_2 = i_2 + -1) {
      if ((b->buffer[i_2] == '\n') && (line_end = line_end + 1, i == 0)) {
        i = i_2 + 1;
      }
    }
    for (iStack_38 = loc + 1; i_1 = loc, iStack_38 < b->size; iStack_38 = iStack_38 + 1) {
      if (b->buffer[iStack_38] == '\n') {
        i_1 = iStack_38;
        break;
      }
    }
    (**b->_vptr_input_buffer)();
    uVar1 = std::__cxx11::string::c_str();
    fprintf(__stream,"Error at %s:%d:%d: %s\n",uVar1,(ulong)(uint)line_end,(ulong)(uint)(loc - i),
            msg);
    fwrite(b->buffer + i,(long)(i_1 - i),1,_stderr);
    putc(10,_stderr);
    for (local_3c = 0; local_3c < loc - i; local_3c = local_3c + 1) {
      local_49 = '\t';
      if (b->buffer[local_3c + i] != '\t') {
        local_49 = ' ';
      }
      putc((int)local_49,_stderr);
    }
    putc(0x5e,_stderr);
    putc(10,_stderr);
  }
  return;
}

Assistant:

void
text_input_buffer::parse_error(const char *msg,
                               input_buffer &b,
                               int loc)
{
	int line_count = 1;
	int line_start = 0;
	int line_end = loc;
	if (loc < 0 || loc > b.size)
	{
		return;
	}
	for (int i=loc ; i>0 ; --i)
	{
		if (b.buffer[i] == '\n')
		{
			line_count++;
			if (line_start == 0)
			{
				line_start = i+1;
			}
		}
	}
	for (int i=loc+1 ; i<b.size ; ++i)
	{
		if (b.buffer[i] == '\n')
		{
			line_end = i;
			break;
		}
	}
	fprintf(stderr, "Error at %s:%d:%d: %s\n", b.filename().c_str(), line_count, loc - line_start, msg);
	fwrite(&b.buffer[line_start], line_end-line_start, 1, stderr);
	putc('\n', stderr);
	for (int i=0 ; i<(loc-line_start) ; ++i)
	{
		char c = (b.buffer[i+line_start] == '\t') ? '\t' : ' ';
		putc(c, stderr);
	}
	putc('^', stderr);
	putc('\n', stderr);
}